

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O2

void PrintUsers(InstructionVMGraphContext *ctx,VmValue *value,bool fullNames)

{
  VmValue **ppVVar1;
  uint i;
  uint index;
  
  if (ctx->showUsers == true) {
    Print(ctx,"[");
    if (value->hasSideEffects == true) {
      Print(ctx,"self");
    }
    for (index = 0; index < (value->users).count; index = index + 1) {
      if ((index != 0) || (value->hasSideEffects != false)) {
        Print(ctx,", ");
      }
      ppVVar1 = SmallArray<VmValue_*,_8U>::operator[](&value->users,index);
      PrintName(ctx,*ppVVar1,fullNames,true);
    }
    Print(ctx,"] ");
    return;
  }
  return;
}

Assistant:

void PrintUsers(InstructionVMGraphContext &ctx, VmValue *value, bool fullNames)
{
	if(!ctx.showUsers)
		return;

	Print(ctx, "[");

	if(value->hasSideEffects)
		Print(ctx, "self");

	for(unsigned i = 0; i < value->users.size(); i++)
	{
		if(value->hasSideEffects || i != 0)
			Print(ctx, ", ");

		PrintName(ctx, value->users[i], fullNames, true);
	}

	Print(ctx, "] ");
}